

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseLifLayer.cpp
# Opt level: O2

ILayer * __thiscall DenseLifLayer::Relax(DenseLifLayer *this,Time time)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar1 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->super_ILayer).neurons.
                 super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_INeuron[6])(time,*ppIVar2,0);
  }
  return &this->super_ILayer;
}

Assistant:

ILayer &DenseLifLayer::Relax( SPIKING_NN::Time time )
{
    for ( auto neuron : neurons ) {
        neuron->RelaxOutput( time, false );
    }
    return *this;
}